

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmCustomCommandLines *this_00;
  cmMakefile *this_01;
  cmake *this_02;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GlobalTargetInfo *this_03;
  allocator local_2a1;
  string cfgArg;
  allocator local_279;
  cmCustomCommandLine localCmdLine;
  cmCustomCommandLine singleLine;
  string cmd;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  pointer local_200;
  pointer pcStack_1f8;
  pointer local_1f0;
  pointer pbStack_1e8;
  pointer local_1e0;
  pointer pbStack_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  bool local_1b0;
  GlobalTargetInfo gti;
  char *pcVar4;
  
  this_01 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar3 = (*this->_vptr_cmGlobalGenerator[0xf])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::string((string *)&gti,"CMAKE_SKIP_INSTALL_RULES",(allocator *)&cmd);
  bVar2 = cmMakefile::IsOn(this_01,&gti.Name);
  std::__cxx11::string::~string((string *)&gti);
  if ((bVar2 & this->InstallTargetEnabled) == 1) {
    this_02 = this->CMakeInstance;
    std::__cxx11::string::string
              ((string *)&gti,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,(allocator *)&cfgArg);
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&cmd,this_01);
    cmake::IssueMessage(this_02,WARNING,&gti.Name,(cmListFileBacktrace *)&cmd);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cmd);
    this_03 = &gti;
    goto LAB_0035c68f;
  }
  if (bVar2 || this->InstallTargetEnabled != true) {
    return;
  }
  if (((pcVar4 == (char *)0x0) || (*pcVar4 == '.')) || (*pcVar4 == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&gti);
    if ((this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::operator<<((ostream *)&gti,"Only default component available");
    }
    else {
      std::operator<<((ostream *)&gti,"Available install components are: ");
      std::__cxx11::string::string((string *)&cfgArg," ",(allocator *)&localCmdLine);
      cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&cmd,'\"',&this->InstallComponents,'\"',&cfgArg);
      std::operator<<((ostream *)&gti,(string *)&cmd);
      std::__cxx11::string::~string((string *)&cmd);
      std::__cxx11::string::~string((string *)&cfgArg);
    }
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    local_220._M_p = (pointer)&local_210;
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    local_200 = (pointer)0x0;
    pcStack_1f8 = (pointer)0x0;
    local_1f0 = (pointer)0x0;
    pbStack_1e8 = (pointer)0x0;
    local_1e0 = (pointer)0x0;
    pbStack_1d8 = (pointer)0x0;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0 = false;
    std::__cxx11::string::assign((char *)&cmd);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_220,(string *)&cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
    local_1b0 = false;
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)&cmd);
    GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)&cmd);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gti);
  }
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::__cxx11::string::string((string *)&cmd,(string *)psVar5);
  gti.Name._M_dataplus._M_p = (pointer)&gti.Name.field_2;
  gti.Name._M_string_length = 0;
  gti.Name.field_2._M_local_buf[0] = '\0';
  gti.Message._M_dataplus._M_p = (pointer)&gti.Message.field_2;
  gti.Message._M_string_length = 0;
  gti.Message.field_2._M_local_buf[0] = '\0';
  gti.WorkingDir._M_dataplus._M_p = (pointer)&gti.WorkingDir.field_2;
  gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gti.Depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  gti.Depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gti.Depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gti.WorkingDir._M_string_length = 0;
  gti.WorkingDir.field_2._M_local_buf[0] = '\0';
  gti.UsesTerminal = false;
  (*this->_vptr_cmGlobalGenerator[0x14])(this);
  std::__cxx11::string::assign((char *)&gti);
  psVar5 = &gti.Message;
  std::__cxx11::string::assign((char *)psVar5);
  gti.UsesTerminal = true;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
  if (CONCAT44(extraout_var_00,iVar3) == 0) {
    std::__cxx11::string::string
              ((string *)&cfgArg,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",(allocator *)&localCmdLine);
    pcVar6 = cmMakefile::GetDefinition(this_01,&cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
    if ((pcVar6 == (char *)0x0) || (bVar2 = cmSystemTools::IsOff(pcVar6), bVar2)) {
      iVar3 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
      std::__cxx11::string::string
                ((string *)&cfgArg,(char *)CONCAT44(extraout_var_02,iVar3),
                 (allocator *)&localCmdLine);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gti.Depends,
                 &cfgArg);
      goto LAB_0035c2e1;
    }
  }
  else {
    iVar3 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    std::__cxx11::string::string
              ((string *)&cfgArg,(char *)CONCAT44(extraout_var_01,iVar3),(allocator *)&localCmdLine)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gti.Depends,
               &cfgArg);
LAB_0035c2e1:
    std::__cxx11::string::~string((string *)&cfgArg);
  }
  std::__cxx11::string::string((string *)&cfgArg,"CMake_BINARY_DIR",&local_2a1);
  pcVar6 = cmMakefile::GetDefinition(this_01,&cfgArg);
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&cfgArg);
  }
  else {
    std::__cxx11::string::string((string *)&localCmdLine,"CMAKE_CROSSCOMPILING",&local_279);
    bVar2 = cmMakefile::IsOn(this_01,(string *)&localCmdLine);
    std::__cxx11::string::~string((string *)&localCmdLine);
    std::__cxx11::string::~string((string *)&cfgArg);
    if (!bVar2) {
      std::__cxx11::string::assign((char *)&cmd);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&cmd);
  if (((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) && (*pcVar4 != '.')) {
    std::__cxx11::string::string((string *)&cfgArg,"-DBUILD_TYPE=",(allocator *)&localCmdLine);
    iVar3 = (*this->_vptr_cmGlobalGenerator[0x23])(this,this_01);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)&localCmdLine,"CMAKE_CFG_INTDIR",&local_2a1);
      cmMakefile::GetDefinition(this_01,(string *)&localCmdLine);
      std::__cxx11::string::append((char *)&cfgArg);
      std::__cxx11::string::~string((string *)&localCmdLine);
    }
    else {
      std::__cxx11::string::append((char *)&cfgArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&cfgArg);
      std::__cxx11::string::assign((char *)&cfgArg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
  }
  std::__cxx11::string::string((string *)&cfgArg,"-P",(allocator *)&localCmdLine);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
             &cfgArg);
  std::__cxx11::string::~string((string *)&cfgArg);
  std::__cxx11::string::string((string *)&cfgArg,"cmake_install.cmake",(allocator *)&localCmdLine);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
             &cfgArg);
  this_00 = &gti.CommandLines;
  std::__cxx11::string::~string((string *)&cfgArg);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &singleLine);
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::push_back(targets,&gti);
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
  if (CONCAT44(extraout_var_03,iVar3) != 0) {
    std::__cxx11::string::assign((char *)&gti);
    std::__cxx11::string::assign((char *)psVar5);
    gti.UsesTerminal = true;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
              (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&localCmdLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    pbVar1 = localCmdLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&cfgArg,"-DCMAKE_INSTALL_LOCAL_ONLY=1",&local_2a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&localCmdLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ,pbVar1 + 1,&cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               &localCmdLine);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,&gti);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&localCmdLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x16])(this);
  if (CONCAT44(extraout_var_04,iVar3) != 0) {
    std::__cxx11::string::string((string *)&cfgArg,"CMAKE_STRIP",(allocator *)&localCmdLine);
    bVar2 = cmMakefile::IsSet(this_01,&cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&gti);
      std::__cxx11::string::assign((char *)psVar5);
      gti.UsesTerminal = true;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&localCmdLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      std::__cxx11::string::string((string *)&cfgArg,"-DCMAKE_INSTALL_DO_STRIP=1",&local_2a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&localCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,localCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &localCmdLine);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(targets,&gti);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&localCmdLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&singleLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  GlobalTargetInfo::~GlobalTargetInfo(&gti);
  this_03 = (GlobalTargetInfo *)&cmd;
LAB_0035c68f:
  std::__cxx11::string::~string((string *)this_03);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      cmake::WARNING, "CMAKE_SKIP_INSTALL_RULES was enabled even though "
                      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!cmakeCfgIntDir || !*cmakeCfgIntDir || cmakeCfgIntDir[0] == '.') {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(gti);
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.push_back(this->GetPreinstallTargetName());
    } else {
      const char* noall =
        mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (!noall || cmSystemTools::IsOff(noall)) {
        gti.Depends.push_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf);
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += mf->GetDefinition("CMAKE_CFG_INTDIR");
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(localCmdLine);
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != CM_NULLPTR) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(stripCmdLine);
      targets.push_back(gti);
    }
  }
}